

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::FdObserver::~FdObserver(FdObserver *this)

{
  int iVar1;
  Fault f;
  
  do {
    iVar1 = epoll_ctl((this->eventPort->epollFd).fd,2,this->fd,(epoll_event *)0x0);
    if (-1 < iVar1) goto LAB_002dadee;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x157,iVar1,"epoll_ctl(eventPort.epollFd, EPOLL_CTL_DEL, fd, nullptr)","");
    _::Debug::Fault::~Fault(&f);
  }
LAB_002dadee:
  Own<kj::PromiseFulfiller<void>_>::dispose(&(this->hupFulfiller).ptr);
  Own<kj::PromiseFulfiller<void>_>::dispose(&(this->urgentFulfiller).ptr);
  Own<kj::PromiseFulfiller<void>_>::dispose(&(this->writeFulfiller).ptr);
  Own<kj::PromiseFulfiller<void>_>::dispose(&(this->readFulfiller).ptr);
  return;
}

Assistant:

UnixEventPort::FdObserver::~FdObserver() noexcept(false) {
  KJ_SYSCALL(epoll_ctl(eventPort.epollFd, EPOLL_CTL_DEL, fd, nullptr)) { break; }
}